

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O2

UtcTimeStamp * __thiscall
FIX::UtcTimeStampField::getValue(UtcTimeStamp *__return_storage_ptr__,UtcTimeStampField *this)

{
  UtcTimeStampConvertor::convert(__return_storage_ptr__,&(this->super_FieldBase).m_string);
  return __return_storage_ptr__;
}

Assistant:

EXCEPT(IncorrectDataFormat) {
    try {
      return UtcTimeStampConvertor::convert(getString());
    } catch (FieldConvertError &) {
      throw IncorrectDataFormat(getTag(), getString());
    }
  }